

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct8x8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  int32_t *piVar43;
  int in_ECX;
  uint uVar44;
  uint uVar45;
  uint in_EDX;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  __m256i y;
  __m256i x;
  __m256i v7;
  __m256i v6;
  __m256i v5;
  __m256i v4;
  __m256i v3;
  __m256i v2;
  __m256i v1;
  __m256i v0;
  __m256i u7;
  __m256i u6;
  __m256i u5;
  __m256i u4;
  __m256i u3;
  __m256i u2;
  __m256i u1;
  __m256i u0;
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rnding;
  __m256i cospi16;
  __m256i cospim16;
  __m256i cospi48;
  __m256i cospi32;
  __m256i cospi8;
  __m256i cospi40;
  __m256i cospim40;
  __m256i cospi24;
  __m256i cospim8;
  __m256i cospi56;
  int32_t *cospi;
  char local_149c;
  char local_1490;
  uint shift;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  undefined8 in_stack_ffffffffffffeba0;
  undefined8 in_stack_ffffffffffffeba8;
  undefined4 in_stack_ffffffffffffebb0;
  undefined4 in_stack_ffffffffffffebb4;
  undefined8 in_stack_ffffffffffffebb8;
  undefined8 in_stack_ffffffffffffebc0;
  undefined8 in_stack_ffffffffffffebc8;
  longlong in_stack_ffffffffffffebd0;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  char local_fd4;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  __m256i *local_140;
  __m256i *palStack_138;
  __m256i *palStack_130;
  __m256i *palStack_e8;
  
  piVar43 = cospi_arr(in_EDX);
  uVar45 = piVar43[0x38];
  auVar48 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
  auVar48 = vpinsrd_avx(auVar48,uVar45,2);
  auVar48 = vpinsrd_avx(auVar48,uVar45,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
  auVar1 = vpinsrd_avx(auVar1,uVar45,2);
  auVar1 = vpinsrd_avx(auVar1,uVar45,3);
  uStack_470 = auVar1._0_8_;
  uStack_468 = auVar1._8_8_;
  uVar38 = -piVar43[8];
  auVar1 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar1 = vpinsrd_avx(auVar1,uVar38,2);
  auVar1 = vpinsrd_avx(auVar1,uVar38,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar2 = vpinsrd_avx(auVar2,uVar38,2);
  auVar2 = vpinsrd_avx(auVar2,uVar38,3);
  uStack_430 = auVar2._0_8_;
  uStack_428 = auVar2._8_8_;
  uVar45 = piVar43[0x18];
  auVar2 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
  auVar2 = vpinsrd_avx(auVar2,uVar45,2);
  auVar2 = vpinsrd_avx(auVar2,uVar45,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
  auVar3 = vpinsrd_avx(auVar3,uVar45,2);
  auVar3 = vpinsrd_avx(auVar3,uVar45,3);
  uStack_3f0 = auVar3._0_8_;
  uStack_3e8 = auVar3._8_8_;
  uVar39 = -piVar43[0x28];
  auVar3 = vpinsrd_avx(ZEXT416(uVar39),uVar39,1);
  auVar3 = vpinsrd_avx(auVar3,uVar39,2);
  auVar3 = vpinsrd_avx(auVar3,uVar39,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar39),uVar39,1);
  auVar4 = vpinsrd_avx(auVar4,uVar39,2);
  auVar4 = vpinsrd_avx(auVar4,uVar39,3);
  uStack_3b0 = auVar4._0_8_;
  uStack_3a8 = auVar4._8_8_;
  shift = piVar43[0x28];
  auVar4 = vpinsrd_avx(ZEXT416(shift),shift,1);
  auVar4 = vpinsrd_avx(auVar4,shift,2);
  auVar4 = vpinsrd_avx(auVar4,shift,3);
  auVar5 = vpinsrd_avx(ZEXT416(shift),shift,1);
  auVar5 = vpinsrd_avx(auVar5,shift,2);
  auVar5 = vpinsrd_avx(auVar5,shift,3);
  uStack_370 = auVar5._0_8_;
  uStack_368 = auVar5._8_8_;
  uVar49 = piVar43[8];
  auVar5 = vpinsrd_avx(ZEXT416(uVar49),uVar49,1);
  auVar5 = vpinsrd_avx(auVar5,uVar49,2);
  auVar5 = vpinsrd_avx(auVar5,uVar49,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar49),uVar49,1);
  auVar6 = vpinsrd_avx(auVar6,uVar49,2);
  auVar6 = vpinsrd_avx(auVar6,uVar49,3);
  uStack_330 = auVar6._0_8_;
  uStack_328 = auVar6._8_8_;
  uVar50 = piVar43[0x20];
  auVar6 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar6 = vpinsrd_avx(auVar6,uVar50,2);
  auVar6 = vpinsrd_avx(auVar6,uVar50,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar7 = vpinsrd_avx(auVar7,uVar50,2);
  auVar7 = vpinsrd_avx(auVar7,uVar50,3);
  uStack_2f0 = auVar7._0_8_;
  uStack_2e8 = auVar7._8_8_;
  uVar51 = piVar43[0x30];
  auVar7 = vpinsrd_avx(ZEXT416(uVar51),uVar51,1);
  auVar7 = vpinsrd_avx(auVar7,uVar51,2);
  auVar7 = vpinsrd_avx(auVar7,uVar51,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar51),uVar51,1);
  auVar8 = vpinsrd_avx(auVar8,uVar51,2);
  auVar8 = vpinsrd_avx(auVar8,uVar51,3);
  uStack_2b0 = auVar8._0_8_;
  uStack_2a8 = auVar8._8_8_;
  uVar40 = -piVar43[0x10];
  auVar8 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar8 = vpinsrd_avx(auVar8,uVar40,2);
  auVar8 = vpinsrd_avx(auVar8,uVar40,3);
  auVar9 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar9 = vpinsrd_avx(auVar9,uVar40,2);
  auVar9 = vpinsrd_avx(auVar9,uVar40,3);
  uStack_270 = auVar9._0_8_;
  uStack_268 = auVar9._8_8_;
  uVar52 = piVar43[0x10];
  auVar9 = vpinsrd_avx(ZEXT416(uVar52),uVar52,1);
  auVar9 = vpinsrd_avx(auVar9,uVar52,2);
  auVar9 = vpinsrd_avx(auVar9,uVar52,3);
  auVar47 = vpinsrd_avx(ZEXT416(uVar52),uVar52,1);
  auVar47 = vpinsrd_avx(auVar47,uVar52,2);
  auVar47 = vpinsrd_avx(auVar47,uVar52,3);
  uStack_230 = auVar47._0_8_;
  uStack_228 = auVar47._8_8_;
  local_fd4 = (char)in_EDX;
  uVar41 = 1 << (local_fd4 - 1U & 0x1f);
  auVar47 = vpinsrd_avx(ZEXT416(uVar41),uVar41,1);
  auVar47 = vpinsrd_avx(auVar47,uVar41,2);
  auVar47 = vpinsrd_avx(auVar47,uVar41,3);
  auVar46 = vpinsrd_avx(ZEXT416(uVar41),uVar41,1);
  auVar46 = vpinsrd_avx(auVar46,uVar41,2);
  auVar46 = vpinsrd_avx(auVar46,uVar41,3);
  auVar46 = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar46;
  auVar47 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar47;
  uStack_1f0 = auVar47._0_8_;
  uStack_1e8 = auVar47._8_8_;
  iVar42 = 8;
  if (in_ECX != 0) {
    iVar42 = 6;
  }
  if (in_R8D + iVar42 < 0x10) {
    local_1490 = '\x10';
  }
  else {
    local_1490 = '\b';
    if (in_ECX != 0) {
      local_1490 = '\x06';
    }
    local_1490 = (char)in_R8D + local_1490;
  }
  uVar44 = -(1 << (local_1490 - 1U & 0x1f));
  auVar47 = vpinsrd_avx(ZEXT416(uVar44),uVar44,1);
  auVar47 = vpinsrd_avx(auVar47,uVar44,2);
  vpinsrd_avx(auVar47,uVar44,3);
  auVar47 = vpinsrd_avx(ZEXT416(uVar44),uVar44,1);
  auVar47 = vpinsrd_avx(auVar47,uVar44,2);
  vpinsrd_avx(auVar47,uVar44,3);
  uVar44 = (1 << (local_1490 - 1U & 0x1f)) - 1;
  auVar47 = vpinsrd_avx(ZEXT416(uVar44),uVar44,1);
  auVar47 = vpinsrd_avx(auVar47,uVar44,2);
  vpinsrd_avx(auVar47,uVar44,3);
  auVar47 = vpinsrd_avx(ZEXT416(uVar44),uVar44,1);
  auVar47 = vpinsrd_avx(auVar47,uVar44,2);
  vpinsrd_avx(auVar47,uVar44,3);
  auVar27._16_8_ = uStack_470;
  auVar27._0_16_ = auVar48;
  auVar27._24_8_ = uStack_468;
  auVar10 = vpmulld_avx2(in_RDI[1],auVar27);
  auVar26._16_8_ = uStack_430;
  auVar26._0_16_ = auVar1;
  auVar26._24_8_ = uStack_428;
  auVar11 = vpmulld_avx2(in_RDI[7],auVar26);
  auVar10 = vpaddd_avx2(auVar10,auVar11);
  auVar37._16_8_ = uStack_1f0;
  auVar37._0_16_ = auVar46;
  auVar37._24_8_ = uStack_1e8;
  auVar10 = vpaddd_avx2(auVar10,auVar37);
  vpsrad_avx2(auVar10,ZEXT416(in_EDX));
  auVar25._16_8_ = uStack_330;
  auVar25._0_16_ = auVar5;
  auVar25._24_8_ = uStack_328;
  auVar10 = vpmulld_avx2(in_RDI[1],auVar25);
  auVar24._16_8_ = uStack_470;
  auVar24._0_16_ = auVar48;
  auVar24._24_8_ = uStack_468;
  auVar11 = vpmulld_avx2(in_RDI[7],auVar24);
  auVar10 = vpaddd_avx2(auVar10,auVar11);
  auVar36._16_8_ = uStack_1f0;
  auVar36._0_16_ = auVar46;
  auVar36._24_8_ = uStack_1e8;
  auVar10 = vpaddd_avx2(auVar10,auVar36);
  vpsrad_avx2(auVar10,ZEXT416(in_EDX));
  auVar23._16_8_ = uStack_3f0;
  auVar23._0_16_ = auVar2;
  auVar23._24_8_ = uStack_3e8;
  auVar10 = vpmulld_avx2(in_RDI[5],auVar23);
  auVar22._16_8_ = uStack_3b0;
  auVar22._0_16_ = auVar3;
  auVar22._24_8_ = uStack_3a8;
  auVar11 = vpmulld_avx2(in_RDI[3],auVar22);
  auVar10 = vpaddd_avx2(auVar10,auVar11);
  auVar35._16_8_ = uStack_1f0;
  auVar35._0_16_ = auVar46;
  auVar35._24_8_ = uStack_1e8;
  auVar10 = vpaddd_avx2(auVar10,auVar35);
  vpsrad_avx2(auVar10,ZEXT416(in_EDX));
  auVar21._16_8_ = uStack_370;
  auVar21._0_16_ = auVar4;
  auVar21._24_8_ = uStack_368;
  auVar10 = vpmulld_avx2(in_RDI[5],auVar21);
  auVar20._16_8_ = uStack_3f0;
  auVar20._0_16_ = auVar2;
  auVar20._24_8_ = uStack_3e8;
  auVar11 = vpmulld_avx2(in_RDI[3],auVar20);
  auVar10 = vpaddd_avx2(auVar10,auVar11);
  auVar34._16_8_ = uStack_1f0;
  auVar34._0_16_ = auVar46;
  auVar34._24_8_ = uStack_1e8;
  auVar10 = vpaddd_avx2(auVar10,auVar34);
  vpsrad_avx2(auVar10,ZEXT416(in_EDX));
  auVar19._16_8_ = uStack_2f0;
  auVar19._0_16_ = auVar6;
  auVar19._24_8_ = uStack_2e8;
  auVar11 = vpmulld_avx2(*in_RDI,auVar19);
  auVar18._16_8_ = uStack_2f0;
  auVar18._0_16_ = auVar6;
  auVar18._24_8_ = uStack_2e8;
  auVar12 = vpmulld_avx2(in_RDI[4],auVar18);
  auVar10 = vpaddd_avx2(auVar11,auVar12);
  auVar33._16_8_ = uStack_1f0;
  auVar33._0_16_ = auVar46;
  auVar33._24_8_ = uStack_1e8;
  auVar10 = vpaddd_avx2(auVar10,auVar33);
  vpsrad_avx2(auVar10,ZEXT416(in_EDX));
  auVar10 = vpsubd_avx2(auVar11,auVar12);
  auVar32._16_8_ = uStack_1f0;
  auVar32._0_16_ = auVar46;
  auVar32._24_8_ = uStack_1e8;
  auVar10 = vpaddd_avx2(auVar10,auVar32);
  vpsrad_avx2(auVar10,ZEXT416(in_EDX));
  auVar17._16_8_ = uStack_2b0;
  auVar17._0_16_ = auVar7;
  auVar17._24_8_ = uStack_2a8;
  auVar10 = vpmulld_avx2(in_RDI[2],auVar17);
  auVar16._16_8_ = uStack_270;
  auVar16._0_16_ = auVar8;
  auVar16._24_8_ = uStack_268;
  auVar11 = vpmulld_avx2(in_RDI[6],auVar16);
  auVar10 = vpaddd_avx2(auVar10,auVar11);
  auVar31._16_8_ = uStack_1f0;
  auVar31._0_16_ = auVar46;
  auVar31._24_8_ = uStack_1e8;
  auVar10 = vpaddd_avx2(auVar10,auVar31);
  vpsrad_avx2(auVar10,ZEXT416(in_EDX));
  auVar15._16_8_ = uStack_230;
  auVar15._0_16_ = auVar9;
  auVar15._24_8_ = uStack_228;
  auVar10 = vpmulld_avx2(in_RDI[2],auVar15);
  auVar14._16_8_ = uStack_2b0;
  auVar14._0_16_ = auVar7;
  auVar14._24_8_ = uStack_2a8;
  auVar11 = vpmulld_avx2(in_RDI[6],auVar14);
  auVar10 = vpaddd_avx2(auVar10,auVar11);
  auVar30._16_8_ = uStack_1f0;
  auVar30._0_16_ = auVar46;
  auVar30._24_8_ = uStack_1e8;
  auVar10 = vpaddd_avx2(auVar10,auVar30);
  vpsrad_avx2(auVar10,ZEXT416(in_EDX));
  in0[1] = in_stack_ffffffffffffebc0;
  in0[0] = in_stack_ffffffffffffebb8;
  in0[2] = in_stack_ffffffffffffebc8;
  in0[3] = in_stack_ffffffffffffebd0;
  in1[0]._4_4_ = uVar41;
  in1[0]._0_4_ = uVar52;
  in1[1] = in_stack_ffffffffffffeba0;
  in1[2] = in_stack_ffffffffffffeba8;
  in1[3]._0_4_ = in_stack_ffffffffffffebb0;
  in1[3]._4_4_ = in_stack_ffffffffffffebb4;
  addsub_avx2(in0,in1,(__m256i *)CONCAT44(uVar40,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
              (__m256i *)CONCAT44(shift,uVar39),(__m256i *)CONCAT44(uVar45,uVar38));
  in0_00[1] = in_stack_ffffffffffffebc0;
  in0_00[0] = in_stack_ffffffffffffebb8;
  in0_00[2] = in_stack_ffffffffffffebc8;
  in0_00[3] = in_stack_ffffffffffffebd0;
  in1_00[0]._4_4_ = uVar41;
  in1_00[0]._0_4_ = uVar52;
  in1_00[1] = in_stack_ffffffffffffeba0;
  in1_00[2] = in_stack_ffffffffffffeba8;
  in1_00[3]._0_4_ = in_stack_ffffffffffffebb0;
  in1_00[3]._4_4_ = in_stack_ffffffffffffebb4;
  addsub_avx2(in0_00,in1_00,(__m256i *)CONCAT44(uVar40,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
              (__m256i *)CONCAT44(shift,uVar39),(__m256i *)CONCAT44(uVar45,uVar38));
  in0_01[1] = in_stack_ffffffffffffebc0;
  in0_01[0] = in_stack_ffffffffffffebb8;
  in0_01[2] = in_stack_ffffffffffffebc8;
  in0_01[3] = in_stack_ffffffffffffebd0;
  in1_01[0]._4_4_ = uVar41;
  in1_01[0]._0_4_ = uVar52;
  in1_01[1] = in_stack_ffffffffffffeba0;
  in1_01[2] = in_stack_ffffffffffffeba8;
  in1_01[3]._0_4_ = in_stack_ffffffffffffebb0;
  in1_01[3]._4_4_ = in_stack_ffffffffffffebb4;
  addsub_avx2(in0_01,in1_01,(__m256i *)CONCAT44(uVar40,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
              (__m256i *)CONCAT44(shift,uVar39),(__m256i *)CONCAT44(uVar45,uVar38));
  in0_02[1] = in_stack_ffffffffffffebc0;
  in0_02[0] = in_stack_ffffffffffffebb8;
  in0_02[2] = in_stack_ffffffffffffebc8;
  in0_02[3] = in_stack_ffffffffffffebd0;
  in1_02[0]._4_4_ = uVar41;
  in1_02[0]._0_4_ = uVar52;
  in1_02[1] = in_stack_ffffffffffffeba0;
  in1_02[2] = in_stack_ffffffffffffeba8;
  in1_02[3]._0_4_ = in_stack_ffffffffffffebb0;
  in1_02[3]._4_4_ = in_stack_ffffffffffffebb4;
  addsub_avx2(in0_02,in1_02,(__m256i *)CONCAT44(uVar40,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
              (__m256i *)CONCAT44(shift,uVar39),(__m256i *)CONCAT44(uVar45,uVar38));
  auVar13._8_8_ = uStack_1378;
  auVar13._0_8_ = local_1380;
  auVar13._16_8_ = uStack_1370;
  auVar13._24_8_ = uStack_1368;
  auVar11._16_8_ = uStack_2f0;
  auVar11._0_16_ = auVar6;
  auVar11._24_8_ = uStack_2e8;
  auVar11 = vpmulld_avx2(auVar13,auVar11);
  auVar12._8_8_ = uStack_1398;
  auVar12._0_8_ = local_13a0;
  auVar12._16_8_ = uStack_1390;
  auVar12._24_8_ = uStack_1388;
  auVar10._16_8_ = uStack_2f0;
  auVar10._0_16_ = auVar6;
  auVar10._24_8_ = uStack_2e8;
  auVar12 = vpmulld_avx2(auVar12,auVar10);
  auVar10 = vpaddd_avx2(auVar12,auVar11);
  auVar29._16_8_ = uStack_1f0;
  auVar29._0_16_ = auVar46;
  auVar29._24_8_ = uStack_1e8;
  auVar10 = vpaddd_avx2(auVar10,auVar29);
  vpsrad_avx2(auVar10,ZEXT416(in_EDX));
  auVar10 = vpsubd_avx2(auVar12,auVar11);
  auVar28._16_8_ = uStack_1f0;
  auVar28._0_16_ = auVar46;
  auVar28._24_8_ = uStack_1e8;
  auVar10 = vpaddd_avx2(auVar10,auVar28);
  vpsrad_avx2(auVar10,ZEXT416(in_EDX));
  in0_03[1] = in_stack_ffffffffffffebc0;
  in0_03[0] = in_stack_ffffffffffffebb8;
  in0_03[2] = in_stack_ffffffffffffebc8;
  in0_03[3] = in_stack_ffffffffffffebd0;
  in1_03[0]._4_4_ = uVar41;
  in1_03[0]._0_4_ = uVar52;
  in1_03[1] = in_stack_ffffffffffffeba0;
  in1_03[2] = in_stack_ffffffffffffeba8;
  in1_03[3]._0_4_ = in_stack_ffffffffffffebb0;
  in1_03[3]._4_4_ = in_stack_ffffffffffffebb4;
  addsub_avx2(in0_03,in1_03,(__m256i *)CONCAT44(uVar40,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
              (__m256i *)CONCAT44(shift,uVar39),(__m256i *)CONCAT44(uVar45,uVar38));
  in0_04[1] = in_stack_ffffffffffffebc0;
  in0_04[0] = in_stack_ffffffffffffebb8;
  in0_04[2] = in_stack_ffffffffffffebc8;
  in0_04[3] = in_stack_ffffffffffffebd0;
  in1_04[0]._4_4_ = uVar41;
  in1_04[0]._0_4_ = uVar52;
  in1_04[1] = in_stack_ffffffffffffeba0;
  in1_04[2] = in_stack_ffffffffffffeba8;
  in1_04[3]._0_4_ = in_stack_ffffffffffffebb0;
  in1_04[3]._4_4_ = in_stack_ffffffffffffebb4;
  addsub_avx2(in0_04,in1_04,(__m256i *)CONCAT44(uVar40,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
              (__m256i *)CONCAT44(shift,uVar39),(__m256i *)CONCAT44(uVar45,uVar38));
  in0_05[1] = in_stack_ffffffffffffebc0;
  in0_05[0] = in_stack_ffffffffffffebb8;
  in0_05[2] = in_stack_ffffffffffffebc8;
  in0_05[3] = in_stack_ffffffffffffebd0;
  in1_05[0]._4_4_ = uVar41;
  in1_05[0]._0_4_ = uVar52;
  in1_05[1] = in_stack_ffffffffffffeba0;
  in1_05[2] = in_stack_ffffffffffffeba8;
  in1_05[3]._0_4_ = in_stack_ffffffffffffebb0;
  in1_05[3]._4_4_ = in_stack_ffffffffffffebb4;
  addsub_avx2(in0_05,in1_05,(__m256i *)CONCAT44(uVar40,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
              (__m256i *)CONCAT44(shift,uVar39),(__m256i *)CONCAT44(uVar45,uVar38));
  in0_06[1] = in_stack_ffffffffffffebc0;
  in0_06[0] = in_stack_ffffffffffffebb8;
  in0_06[2] = in_stack_ffffffffffffebc8;
  in0_06[3] = in_stack_ffffffffffffebd0;
  in1_06[0]._4_4_ = uVar41;
  in1_06[0]._0_4_ = uVar52;
  in1_06[1] = in_stack_ffffffffffffeba0;
  in1_06[2] = in_stack_ffffffffffffeba8;
  in1_06[3]._0_4_ = in_stack_ffffffffffffebb0;
  in1_06[3]._4_4_ = in_stack_ffffffffffffebb4;
  addsub_avx2(in0_06,in1_06,(__m256i *)CONCAT44(uVar40,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
              (__m256i *)CONCAT44(shift,uVar39),(__m256i *)CONCAT44(uVar45,uVar38));
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_149c = '\x10';
    }
    else {
      local_149c = (char)in_R8D + '\x06';
    }
    uVar45 = -(1 << (local_149c - 1U & 0x1f));
    auVar48 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
    auVar48 = vpinsrd_avx(auVar48,uVar45,2);
    auVar48 = vpinsrd_avx(auVar48,uVar45,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
    auVar1 = vpinsrd_avx(auVar1,uVar45,2);
    auVar1 = vpinsrd_avx(auVar1,uVar45,3);
    local_140 = auVar48._0_8_;
    palStack_138 = auVar48._8_8_;
    palStack_130 = auVar1._0_8_;
    uVar45 = (1 << (local_149c - 1U & 0x1f)) - 1;
    auVar48 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
    auVar48 = vpinsrd_avx(auVar48,uVar45,2);
    auVar48 = vpinsrd_avx(auVar48,uVar45,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
    auVar1 = vpinsrd_avx(auVar1,uVar45,2);
    vpinsrd_avx(auVar1,uVar45,3);
    auVar48 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar48;
    palStack_e8 = auVar48._8_8_;
    iVar42 = auVar48._4_4_;
    round_shift_4x4_avx2((__m256i *)CONCAT44(uVar50,uVar49),shift);
    round_shift_4x4_avx2((__m256i *)CONCAT44(uVar50,uVar49),shift);
    highbd_clamp_epi32_avx2(palStack_130,palStack_138,local_140,palStack_e8,iVar42);
  }
  return;
}

Assistant:

static void idct8x8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                         int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i u0, u1, u2, u3, u4, u5, u6, u7;
  __m256i v0, v1, v2, v3, v4, v5, v6, v7;
  __m256i x, y;

  // stage 0
  // stage 1
  // stage 2
  u0 = in[0];
  u1 = in[4];
  u2 = in[2];
  u3 = in[6];

  x = _mm256_mullo_epi32(in[1], cospi56);
  y = _mm256_mullo_epi32(in[7], cospim8);
  u4 = _mm256_add_epi32(x, y);
  u4 = _mm256_add_epi32(u4, rnding);
  u4 = _mm256_srai_epi32(u4, bit);

  x = _mm256_mullo_epi32(in[1], cospi8);
  y = _mm256_mullo_epi32(in[7], cospi56);
  u7 = _mm256_add_epi32(x, y);
  u7 = _mm256_add_epi32(u7, rnding);
  u7 = _mm256_srai_epi32(u7, bit);

  x = _mm256_mullo_epi32(in[5], cospi24);
  y = _mm256_mullo_epi32(in[3], cospim40);
  u5 = _mm256_add_epi32(x, y);
  u5 = _mm256_add_epi32(u5, rnding);
  u5 = _mm256_srai_epi32(u5, bit);

  x = _mm256_mullo_epi32(in[5], cospi40);
  y = _mm256_mullo_epi32(in[3], cospi24);
  u6 = _mm256_add_epi32(x, y);
  u6 = _mm256_add_epi32(u6, rnding);
  u6 = _mm256_srai_epi32(u6, bit);

  // stage 3
  x = _mm256_mullo_epi32(u0, cospi32);
  y = _mm256_mullo_epi32(u1, cospi32);
  v0 = _mm256_add_epi32(x, y);
  v0 = _mm256_add_epi32(v0, rnding);
  v0 = _mm256_srai_epi32(v0, bit);

  v1 = _mm256_sub_epi32(x, y);
  v1 = _mm256_add_epi32(v1, rnding);
  v1 = _mm256_srai_epi32(v1, bit);

  x = _mm256_mullo_epi32(u2, cospi48);
  y = _mm256_mullo_epi32(u3, cospim16);
  v2 = _mm256_add_epi32(x, y);
  v2 = _mm256_add_epi32(v2, rnding);
  v2 = _mm256_srai_epi32(v2, bit);

  x = _mm256_mullo_epi32(u2, cospi16);
  y = _mm256_mullo_epi32(u3, cospi48);
  v3 = _mm256_add_epi32(x, y);
  v3 = _mm256_add_epi32(v3, rnding);
  v3 = _mm256_srai_epi32(v3, bit);

  addsub_avx2(u4, u5, &v4, &v5, &clamp_lo, &clamp_hi);
  addsub_avx2(u7, u6, &v7, &v6, &clamp_lo, &clamp_hi);

  // stage 4
  addsub_avx2(v0, v3, &u0, &u3, &clamp_lo, &clamp_hi);
  addsub_avx2(v1, v2, &u1, &u2, &clamp_lo, &clamp_hi);
  u4 = v4;
  u7 = v7;

  x = _mm256_mullo_epi32(v5, cospi32);
  y = _mm256_mullo_epi32(v6, cospi32);
  u6 = _mm256_add_epi32(y, x);
  u6 = _mm256_add_epi32(u6, rnding);
  u6 = _mm256_srai_epi32(u6, bit);

  u5 = _mm256_sub_epi32(y, x);
  u5 = _mm256_add_epi32(u5, rnding);
  u5 = _mm256_srai_epi32(u5, bit);

  addsub_avx2(u0, u7, out + 0, out + 7, &clamp_lo, &clamp_hi);
  addsub_avx2(u1, u6, out + 1, out + 6, &clamp_lo, &clamp_hi);
  addsub_avx2(u2, u5, out + 2, out + 5, &clamp_lo, &clamp_hi);
  addsub_avx2(u3, u4, out + 3, out + 4, &clamp_lo, &clamp_hi);
  // stage 5
  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    round_shift_4x4_avx2(out, out_shift);
    round_shift_4x4_avx2(out + 4, out_shift);
    highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 8);
  }
}